

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O2

int winmd::reader::parse_ptr(table_base *param_1,byte_view *data)

{
  uint32_t uVar1;
  int iVar2;
  byte_view cursor;
  byte_view local_28;
  
  local_28.m_first = data->m_first;
  local_28.m_last = data->m_last;
  iVar2 = 0;
  while( true ) {
    uVar1 = uncompress_unsigned(&local_28);
    if ((char)uVar1 != '\x0f') break;
    iVar2 = iVar2 + 1;
    data->m_first = local_28.m_first;
    data->m_last = local_28.m_last;
  }
  return iVar2;
}

Assistant:

inline int parse_ptr(table_base const*, byte_view& data)
    {
        auto cursor = data;
        int result = 0;
        while(uncompress_enum<ElementType>(cursor) == ElementType::Ptr)
        {
            ++result;
            data = cursor;
        }
        return result;
    }